

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChParticleCloud.cpp
# Opt level: O1

void __thiscall
chrono::ChParticleCloud::IntStateGetIncrement
          (ChParticleCloud *this,uint off_x,ChState *x_new,ChState *x,uint off_v,ChStateDelta *Dv)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  double *pdVar5;
  double *pdVar6;
  double dVar7;
  ulong uVar8;
  char *__function;
  ulong uVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  double dVar14;
  double dVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  double dVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  double dVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  ChQuaternion<double> q_new;
  ChQuaternion<double> q_old;
  double *local_108;
  double dStack_100;
  double local_f8;
  ChState *local_f0;
  ulong local_e8;
  long local_d8;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  ChParticleCloud *local_78;
  ChQuaternion<double> local_70;
  ChQuaternion<double> local_50;
  
  if ((this->particles).
      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (this->particles).
      super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar11 = off_v + 3;
    uVar10 = 1;
    local_78 = this;
    do {
      uVar9 = (ulong)off_x;
      lVar1 = (x_new->super_ChVectorDynamic<double>).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if ((lVar1 <= (long)uVar9) ||
         (lVar2 = (x->super_ChVectorDynamic<double>).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
         lVar2 <= (long)uVar9)) {
LAB_00538547:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0xb5,
                      "CoeffReturnType Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 0>::operator()(Index) const [Derived = Eigen::Matrix<double, -1, 1>, Level = 0]"
                     );
      }
      uVar12 = (ulong)uVar11;
      lVar3 = (Dv->super_ChVectorDynamic<double>).
              super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      if (lVar3 <= (long)(ulong)(uVar11 - 3)) {
LAB_00538566:
        __assert_fail("index >= 0 && index < size()",
                      "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x1ab,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator()(Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
                     );
      }
      pdVar4 = (x_new->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      pdVar5 = (x->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      pdVar6 = (Dv->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      pdVar6[uVar11 - 3] = pdVar4[uVar9] - pdVar5[uVar9];
      uVar9 = (ulong)(off_x + 1);
      if ((lVar1 <= (long)uVar9) || (lVar2 <= (long)uVar9)) goto LAB_00538547;
      if (lVar3 <= (long)(ulong)(uVar11 - 2)) goto LAB_00538566;
      pdVar6[uVar11 - 2] = pdVar4[uVar9] - pdVar5[uVar9];
      uVar9 = (ulong)(off_x + 2);
      if ((lVar1 <= (long)uVar9) || (lVar2 <= (long)uVar9)) goto LAB_00538547;
      if (lVar3 <= (long)(ulong)(uVar11 - 1)) goto LAB_00538566;
      pdVar6[uVar11 - 1] = pdVar4[uVar9] - pdVar5[uVar9];
      uVar9 = (ulong)(off_x + 3);
      local_108 = pdVar5 + uVar9;
      dStack_100 = 1.97626258336499e-323;
      local_f0 = x;
      local_d8 = lVar2;
      if (lVar2 + -4 < (long)uVar9) {
LAB_00538585:
        dStack_100 = 1.97626258336499e-323;
        __function = 
        "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
        ;
        local_e8 = uVar9;
LAB_005385b1:
        __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                      ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
      }
      uVar13 = (ulong)uVar10;
      local_e8 = uVar9;
      ChQuaternion<double>::
      ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_50,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_108,(type *)0x0);
      local_108 = (x_new->super_ChVectorDynamic<double>).
                  super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data +
                  uVar9;
      local_d8 = (x_new->super_ChVectorDynamic<double>).
                 super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows;
      dStack_100 = 1.97626258336499e-323;
      local_f0 = x_new;
      if (local_d8 + -4 < (long)uVar9) goto LAB_00538585;
      local_e8 = uVar9;
      ChQuaternion<double>::
      ChQuaternion<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_70,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_108,(type *)0x0);
      dVar7 = local_50.m_data[3];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_50.m_data[0];
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_50.m_data[1];
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_50.m_data[2];
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_50.m_data[3];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = local_70.m_data[1];
      auVar29._8_8_ = 0;
      auVar29._0_8_ = local_70.m_data[2];
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_70.m_data[3];
      auVar27._8_8_ = 0;
      auVar27._0_8_ = local_70.m_data[0] * local_50.m_data[1];
      auVar16 = vfmsub231sd_fma(auVar27,auVar24,auVar31);
      auVar16 = vfmadd231sd_fma(auVar16,auVar22,auVar29);
      auVar27 = vfnmadd231sd_fma(auVar16,auVar25,auVar17);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_70.m_data[0] * local_50.m_data[2];
      auVar16 = vfmsub231sd_fma(auVar18,auVar24,auVar29);
      auVar16 = vfnmadd231sd_fma(auVar16,auVar22,auVar31);
      auVar16 = vfmadd231sd_fma(auVar16,auVar30,auVar17);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_70.m_data[0] * local_50.m_data[3];
      auVar18 = vfmsub231sd_fma(auVar21,auVar24,auVar17);
      auVar18 = vfmadd231sd_fma(auVar18,auVar25,auVar31);
      auVar18 = vfnmadd231sd_fma(auVar18,auVar30,auVar29);
      dVar20 = auVar18._0_8_;
      local_108 = (double *)0x0;
      dStack_100 = 0.0;
      local_f8 = 0.0;
      dVar14 = auVar16._0_8_;
      auVar16._8_8_ = 0;
      auVar16._0_8_ = dVar14 * dVar14;
      auVar16 = vfmadd231sd_fma(auVar16,auVar27,auVar27);
      auVar16 = vfmadd231sd_fma(auVar16,auVar18,auVar18);
      dVar15 = auVar16._0_8_;
      dVar26 = auVar27._0_8_;
      if (dVar15 <= 1e-30) {
        local_108 = (double *)(dVar26 + dVar26);
        dVar15 = 2.0;
      }
      else {
        local_90 = dVar20;
        local_88 = dVar26;
        local_80 = dVar14;
        if (dVar15 < 0.0) {
          local_98 = local_50.m_data[0];
          local_a0 = local_50.m_data[2];
          local_a8 = local_70.m_data[3];
          local_b0 = local_70.m_data[0];
          local_b8 = local_70.m_data[2];
          local_c0 = local_50.m_data[1];
          local_c8 = local_70.m_data[1];
          dVar15 = sqrt(dVar15);
          auVar29._8_8_ = 0;
          auVar29._0_8_ = local_b8;
          auVar17._8_8_ = 0;
          auVar17._0_8_ = local_a8;
          auVar25._8_8_ = 0;
          auVar25._0_8_ = local_a0;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = local_98;
          dVar14 = local_b0;
          dVar20 = local_c0;
          dVar26 = local_c8;
        }
        else {
          auVar16 = vsqrtsd_avx(auVar16,auVar16);
          dVar15 = auVar16._0_8_;
          dVar14 = local_70.m_data[0];
          dVar20 = local_50.m_data[1];
          dVar26 = local_70.m_data[1];
        }
        auVar23._8_8_ = 0;
        auVar23._0_8_ = dVar7;
        auVar28._8_8_ = 0;
        auVar28._0_8_ = dVar14;
        auVar19._8_8_ = 0;
        auVar19._0_8_ = dVar20 * dVar26;
        auVar16 = vfmadd213sd_fma(auVar28,auVar24,auVar19);
        auVar16 = vfmadd213sd_fma(auVar29,auVar25,auVar16);
        auVar16 = vfmadd213sd_fma(auVar17,auVar23,auVar16);
        dVar14 = atan2(dVar15,auVar16._0_8_);
        dVar15 = (dVar14 + dVar14) / dVar15;
        local_108 = (double *)(dVar15 * local_88);
        dVar20 = local_90;
        dVar14 = local_80;
      }
      dStack_100 = dVar14 * dVar15;
      local_f8 = dVar20 * dVar15;
      if ((Dv->super_ChVectorDynamic<double>).
          super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows + -3 <
          (long)uVar12) {
        __function = 
        "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
        ;
        goto LAB_005385b1;
      }
      pdVar5 = (Dv->super_ChVectorDynamic<double>).
               super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data;
      pdVar4 = pdVar5 + uVar12;
      uVar9 = 3;
      if ((((ulong)pdVar4 & 7) == 0) &&
         (uVar9 = (ulong)(-((uint)((ulong)pdVar4 >> 3) & 0x1fffffff) & 7), 2 < uVar9)) {
        uVar9 = 3;
      }
      if (uVar9 != 0) {
        memcpy(pdVar4,&local_108,(ulong)(uint)((int)uVar9 * 8));
      }
      if (uVar9 < 3) {
        uVar8 = (ulong)(uint)((int)uVar9 * 8);
        memcpy(pdVar5 + uVar9 + uVar12,(void *)((long)&local_108 + uVar8),0x18 - uVar8);
      }
      uVar11 = uVar11 + 6;
      off_x = off_x + 7;
      uVar10 = uVar10 + 1;
    } while (uVar13 < (ulong)((long)(local_78->particles).
                                    super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)(local_78->particles).
                                    super__Vector_base<chrono::ChAparticle_*,_std::allocator<chrono::ChAparticle_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3));
  }
  return;
}

Assistant:

void ChParticleCloud::IntStateGetIncrement(const unsigned int off_x,  // offset in x state vector
                                          const ChState& x_new,            // state vector, position part, incremented result
                                          const ChState& x,          // state vector, initial position part
                                          const unsigned int off_v,  // offset in v state vector
                                          ChStateDelta& Dv     // state vector, increment
                                          ) {
    for (unsigned int j = 0; j < particles.size(); j++) {
        // POSITION:
        Dv(off_v + 6 * j) = x_new(off_x + 7 * j) - x(off_x + 7 * j);
        Dv(off_v + 6 * j + 1) = x_new(off_x + 7 * j + 1) - x(off_x + 7 * j + 1);
        Dv(off_v + 6 * j + 2) = x_new(off_x + 7 * j + 2) - x(off_x + 7 * j + 2);

        // ROTATION (quaternions): Dq_loc = q_old^-1 * q_new,
        //  because   q_new = Dq_abs * q_old   = q_old * Dq_loc
        ChQuaternion<> q_old(x.segment(off_x + 7 * j + 3, 4));
        ChQuaternion<> q_new(x_new.segment(off_x + 7 * j + 3, 4));
        ChQuaternion<> rel_q = q_old.GetConjugate() % q_new;
        Dv.segment(off_v + 6 *j + 3, 3) = rel_q.Q_to_Rotv().eigen();
    }
}